

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::Encrypt
          (DescriptorScriptPubKeyMan *this,CKeyingMaterial *master_key,WalletBatch *batch)

{
  long lVar1;
  uchar *__first;
  bool bVar2;
  mapped_type *this_00;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> crypted_secret;
  CKeyingMaterial secret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  CKeyID local_f4;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_e0;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock56,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x842,false);
  if ((this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    for (p_Var3 = (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
      CKey::GetPubKey(&pubkey,(CKey *)&p_Var3[1]._M_right);
      __first = *(uchar **)(p_Var3 + 2);
      std::vector<unsigned_char,secure_allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&secret,__first,
                 __first + (ulong)(__first != (uchar *)0x0) * 0x20,(allocator_type *)&local_e0);
      crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CPubKey::GetHash((uint256 *)&local_e0,&pubkey);
      bVar2 = EncryptSecret(master_key,&secret,(uint256 *)&local_e0,&crypted_secret);
      if (!bVar2) {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  );
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                  (&secret.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
        bVar2 = false;
        goto LAB_004308f5;
      }
      memcpy(&local_e0,&pubkey,0x41);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_e0.second,&crypted_secret);
      CPubKey::GetID(&local_f4,&pubkey);
      this_00 = std::
                map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                ::operator[](&this->m_map_crypted_keys,&local_f4);
      std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
                (this_00,&local_e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&local_e0.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
      (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_e0,this);
      WalletBatch::WriteCryptedDescriptorKey
                (batch,(uint256 *)&local_e0,&pubkey,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&crypted_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                (&secret.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
    }
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::clear(&(this->m_map_keys)._M_t);
    bVar2 = true;
  }
LAB_004308f5:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock56.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::Encrypt(const CKeyingMaterial& master_key, WalletBatch* batch)
{
    LOCK(cs_desc_man);
    if (!m_map_crypted_keys.empty()) {
        return false;
    }

    for (const KeyMap::value_type& key_in : m_map_keys)
    {
        const CKey &key = key_in.second;
        CPubKey pubkey = key.GetPubKey();
        CKeyingMaterial secret{UCharCast(key.begin()), UCharCast(key.end())};
        std::vector<unsigned char> crypted_secret;
        if (!EncryptSecret(master_key, secret, pubkey.GetHash(), crypted_secret)) {
            return false;
        }
        m_map_crypted_keys[pubkey.GetID()] = make_pair(pubkey, crypted_secret);
        batch->WriteCryptedDescriptorKey(GetID(), pubkey, crypted_secret);
    }
    m_map_keys.clear();
    return true;
}